

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_MMDP_OnlineSolve.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  NullPlanner *this;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  double dVar4;
  row_t row;
  QTable q;
  referred_type local_310;
  MDPValueIteration vi;
  SimulationDecPOMDPDiscrete sim;
  Arguments args;
  
  ArgumentHandlers::Arguments::Arguments(&args);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  poVar1 = std::operator<<((ostream *)&std::cout,"Instantiating the problem...");
  std::endl<char,std::char_traits<char>>(poVar1);
  pDVar2 = (DecPOMDPDiscreteInterface *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&args);
  poVar1 = std::operator<<((ostream *)&std::cout,"...done.");
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner(this,999999,pDVar2,(PlanningUnitMADPDiscreteParameters *)0x0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Performing value iteration...");
  std::endl<char,std::char_traits<char>>(poVar1);
  MDPValueIteration::MDPValueIteration(&vi,(PlanningUnitDecPOMDPDiscrete *)this);
  MDPValueIteration::Plan();
  poVar1 = std::operator<<((ostream *)&std::cout,"...done.");
  std::endl<char,std::char_traits<char>>(poVar1);
  MDPValueIteration::GetQTable((uint)&q);
  row.data_.e_ = &local_310;
  row.i_ = 0;
  *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 7;
  poVar1 = std::operator<<((ostream *)&std::cout,"Here\'s first row (state 0) from VI result: \n");
  pbVar3 = boost::numeric::ublas::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar1,
                      (vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                       *)&row);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (&sim,(PlanningUnitDecPOMDPDiscrete *)this,500,0x2a,false);
  dVar4 = runSimulations((PlanningUnitDecPOMDPDiscrete *)this,&sim);
  poVar1 = std::operator<<((ostream *)&std::cout,"Avg reward of ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,500);
  std::operator<<(poVar1," simulations: ");
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(&sim);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&local_310.data_);
  MDPValueIteration::~MDPValueIteration(&vi);
  std::__cxx11::string::~string((string *)&args.maxplus_updateT);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    try
    {
        cout << "Instantiating the problem..."<<endl;
        DecPOMDPDiscreteInterface* decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);
        cout << "...done."<<endl;

        // consider it an infinite-horizon problem by passing MAXHORIZON
        PlanningUnitDecPOMDPDiscrete *np = new NullPlanner(MAXHORIZON, decpomdp);

        ///---VI--------------------------------------------
        // only for reference, compute solution with value iteration
        cout << "Performing value iteration..."<<endl;
        MDPValueIteration vi(*np);
        vi.Plan();
        cout << "...done." <<endl;
        QTable q = vi.GetQTable(0); //<- infinite horizon, so get 1 value function of stage 0
        
        // output results of value iteration at a single state to allow
        // comparison with q learner results
        row_t row = q.GetRow(0);
        cout << setprecision(7)
             << "Here's first row (state 0) from VI result: \n" << row << endl;
        ///---end VI----------------------------------------------

        int nrRuns = 500;
        int seed = 42; //or: time(NULL)
        SimulationDecPOMDPDiscrete sim(*np, nrRuns, seed);

        double r;
        r = runSimulations(np, sim);
        cout << "Avg reward of "<< nrRuns << " simulations: " << r << endl << endl;

    }
    catch(E& e){ e.Print(); }

    return 0;
}